

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

RepeatedPtrFieldBase * __thiscall
google::protobuf::Reflection::GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  bool bVar1;
  uint32_t uVar2;
  RepeatedPtrFieldBase *pRVar3;
  OneofDescriptor *oneof_descriptor;
  LogMessageFatal local_50 [32];
  
  this_00 = &this->schema_;
  bVar1 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar1) {
    if ((field->field_0x1 & 0x10) == 0) {
      oneof_descriptor = (OneofDescriptor *)0x0;
    }
    else {
      oneof_descriptor = (field->scope_).containing_oneof;
      if (oneof_descriptor == (OneofDescriptor *)0x0) goto LAB_0028463c;
    }
    uVar2 = GetOneofCase(this,message,oneof_descriptor);
    bVar1 = uVar2 != field->number_;
  }
  else {
    bVar1 = false;
  }
  if (bVar1) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/message.h"
               ,0x659,0x3c,"!schema_.InRealOneof(field) || HasOneofField(message, field)");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (local_50,8,"Field = ");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_50,(string *)(field->all_names_ + 1));
    if (bVar1) {
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
    }
  }
  bVar1 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar1) {
    bVar1 = internal::ReflectionSchema::IsSplit(this_00,field);
    if (bVar1) {
      GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>();
LAB_0028463c:
      internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                 ,0xa9a);
    }
    uVar2 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
    pRVar3 = (RepeatedPtrFieldBase *)
             ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
  }
  else {
    pRVar3 = GetRawNonOneof<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
  }
  return pRVar3;
}

Assistant:

const Type& Reflection::GetRaw(const Message& message,
                               const FieldDescriptor* field) const {
  ABSL_DCHECK(!schema_.InRealOneof(field) || HasOneofField(message, field))
      << "Field = " << field->full_name();

  if (PROTOBUF_PREDICT_TRUE(!schema_.InRealOneof(field))) {
    return GetRawNonOneof<Type>(message, field);
  }

  // Oneof fields are not split.
  ABSL_DCHECK(!schema_.IsSplit(field));

  const uint32_t field_offset = schema_.GetFieldOffset(field);
  return internal::GetConstRefAtOffset<Type>(message, field_offset);
}